

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O0

_Bool borg_refuel_lantern(void)

{
  char *what;
  wchar_t local_10;
  _Bool local_9;
  wchar_t i;
  
  local_10 = borg_slot(L'\x1b',sv_flask_oil);
  if (((local_10 < L'\0') &&
      (local_10 = borg_slot(L'\x13',sv_light_lantern), L'\xffffffff' < local_10)) &&
     (borg_items[local_10].timeout < 1)) {
    local_10 = L'\xffffffff';
  }
  if (local_10 < L'\0') {
    local_9 = false;
  }
  else if ((uint)borg_items[(int)(z_info->pack_size + 5)].sval == sv_light_lantern) {
    what = format("# Refueling with %s.",borg_items + local_10);
    borg_note(what);
    borg_keypress(0x46);
    borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[local_10]);
    goal_item = -1;
    goal_ware = -1;
    goal_shop = -1;
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool borg_refuel_lantern(void)
{
    int i;

    /* Look for a flask of oil */
    i = borg_slot(TV_FLASK, sv_flask_oil);

    /* None available check for lantern */
    if (i < 0) {
        i = borg_slot(TV_LIGHT, sv_light_lantern);

        /* It better have some oil left */
        if (i >= 0 && borg_items[i].timeout <= 0)
            i = -1;
    }

    /* Still none */
    if (i < 0)
        return (false);

    /* Cant refuel a torch with oil */
    if (borg_items[INVEN_LIGHT].sval != sv_light_lantern) {
        return (false);
    }

    /* Log the message */
    borg_note(format("# Refueling with %s.", borg_items[i].desc));

    /* Perform the action */
    borg_keypress('F');
    borg_keypress(all_letters_nohjkl[i]);

    /* Hack -- Clear "shop" goals */
    goal_shop = goal_ware = goal_item = -1;

    /* Success */
    return (true);
}